

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O2

void map2json_freeTreeMemory(map2json_tree_t *obj)

{
  if (obj != (map2json_tree_t *)0x0) {
    map2json_freeTreeMemory(obj->arrayObjects);
    map2json_freeTreeMemory(obj->children);
    map2json_freeTreeMemory(obj->next);
    free(obj->key);
    free(obj);
    return;
  }
  return;
}

Assistant:

static void map2json_freeTreeMemory(map2json_tree_t *obj) {
	DEBUG_PUT("map2json_freeTreeMemory([map2json_t *])... ");

	if ( obj == NULL ) {
		DEBUG_PUT("map2json_freeTreeMemory([map2json_t *])... DONE");
		return;
	}

	map2json_freeTreeMemory(obj->arrayObjects);
	map2json_freeTreeMemory(obj->children);
	map2json_freeTreeMemory(obj->next);

	if ( obj->key != NULL ) {
		free(obj->key);
	}
	free(obj);
	DEBUG_PUT("map2json_freeTreeMemory([map2json_t *])... DONE");
}